

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O0

void __thiscall
Eigen::JacobiRotation<double>::makeGivens(JacobiRotation<double> *this,double *p,double *q,double r)

{
  int __x;
  JacobiRotation<double> *pJVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  type tVar2;
  double local_50;
  double u_1;
  double t_1;
  double u;
  double t;
  double *r_local;
  double *q_local;
  double *p_local;
  JacobiRotation<double> *this_local;
  
  __x = (int)this;
  t = r;
  r_local = q;
  q_local = p;
  p_local = &this->m_c;
  if ((*q != 0.0) || (NAN(*q))) {
    if ((*p != 0.0) || (NAN(*p))) {
      pJVar1 = this;
      std::abs(__x);
      std::abs((int)pJVar1);
      if (extraout_XMM0_Qa_01 <= extraout_XMM0_Qa_02) {
        u_1 = *q_local / *r_local;
        tVar2 = numext::abs2<double>(&u_1);
        local_50 = sqrt(tVar2 + 1.0);
        if (*r_local <= 0.0 && *r_local != 0.0) {
          local_50 = -local_50;
        }
        this->m_s = -1.0 / local_50;
        this->m_c = -u_1 * this->m_s;
        if (t != 0.0) {
          *(double *)t = *r_local * local_50;
        }
      }
      else {
        u = *r_local / *q_local;
        tVar2 = numext::abs2<double>(&u);
        t_1 = sqrt(tVar2 + 1.0);
        if (*q_local <= 0.0 && *q_local != 0.0) {
          t_1 = -t_1;
        }
        this->m_c = 1.0 / t_1;
        this->m_s = -u * this->m_c;
        if (t != 0.0) {
          *(double *)t = *q_local * t_1;
        }
      }
    }
    else {
      this->m_c = 0.0;
      this->m_s = (double)(~-(ulong)(*q < 0.0) & 0xbff0000000000000 |
                          (ulong)((uint)(-(ulong)(*q < 0.0) >> 0x20) & 0x3ff00000) << 0x20);
      if (r != 0.0) {
        std::abs(__x);
        *(undefined8 *)t = extraout_XMM0_Qa_00;
      }
    }
  }
  else {
    this->m_c = (double)(~-(ulong)(*p < 0.0) & 0x3ff0000000000000 |
                        (ulong)((uint)(-(ulong)(*p < 0.0) >> 0x20) & 0xbff00000) << 0x20);
    this->m_s = 0.0;
    if (r != 0.0) {
      std::abs(__x);
      *(undefined8 *)t = extraout_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void JacobiRotation<Scalar>::makeGivens(const Scalar& p, const Scalar& q, Scalar* r, internal::false_type)
{
  using std::sqrt;
  using std::abs;
  if(q==Scalar(0))
  {
    m_c = p<Scalar(0) ? Scalar(-1) : Scalar(1);
    m_s = Scalar(0);
    if(r) *r = abs(p);
  }
  else if(p==Scalar(0))
  {
    m_c = Scalar(0);
    m_s = q<Scalar(0) ? Scalar(1) : Scalar(-1);
    if(r) *r = abs(q);
  }
  else if(abs(p) > abs(q))
  {
    Scalar t = q/p;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(p<Scalar(0))
      u = -u;
    m_c = Scalar(1)/u;
    m_s = -t * m_c;
    if(r) *r = p * u;
  }
  else
  {
    Scalar t = p/q;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(q<Scalar(0))
      u = -u;
    m_s = -Scalar(1)/u;
    m_c = -t * m_s;
    if(r) *r = q * u;
  }

}